

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

MRIStepCoupling
MRIStepCoupling_Create(int nmat,int stages,int q,int p,sunrealtype *W,sunrealtype *G,sunrealtype *c)

{
  sunrealtype ***pppsVar1;
  sunrealtype **ppsVar2;
  sunrealtype *psVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  MRIStepCoupling pMVar8;
  ulong uVar9;
  ulong uVar10;
  MRISTEP_METHOD_TYPE type;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  sunrealtype *psVar15;
  ulong uVar16;
  
  if (c == (sunrealtype *)0x0 || (stages < 1 || nmat < 1)) {
    return (MRIStepCoupling)0x0;
  }
  type = MRISTEP_EXPLICIT;
  bVar4 = G != (sunrealtype *)0x0 && W != (sunrealtype *)0x0;
  if (G != (sunrealtype *)0x0 && W != (sunrealtype *)0x0) {
    type = MRISTEP_IMEX;
    bVar6 = 0;
  }
  else {
    if (W == (sunrealtype *)0x0 || G != (sunrealtype *)0x0) {
      bVar6 = 0;
      if (G == (sunrealtype *)0x0 || W != (sunrealtype *)0x0) {
        return (MRIStepCoupling)0x0;
      }
      type = MRISTEP_IMPLICIT;
      bVar7 = 1;
      goto LAB_00141850;
    }
    bVar6 = 1;
  }
  bVar7 = 0;
LAB_00141850:
  pMVar8 = MRIStepCoupling_Alloc(nmat,stages,type);
  if (pMVar8 == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  pMVar8->q = q;
  pMVar8->p = p;
  psVar15 = pMVar8->c;
  uVar11 = 1;
  if (1 < stages) {
    uVar11 = (ulong)(uint)stages;
  }
  uVar9 = 0;
  do {
    psVar15[uVar9] = c[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar11 != uVar9);
  uVar9 = (ulong)(uint)stages;
  if ((bool)(bVar6 | bVar4)) {
    uVar14 = 1;
    if (1 < stages) {
      uVar14 = (ulong)(uint)stages;
    }
    uVar13 = 1;
    if (1 < nmat) {
      uVar13 = (ulong)(uint)nmat;
    }
    pppsVar1 = pMVar8->W;
    uVar16 = 0;
    do {
      ppsVar2 = pppsVar1[uVar16];
      uVar12 = 0;
      psVar15 = W;
      do {
        psVar3 = ppsVar2[uVar12];
        uVar10 = 0;
        do {
          psVar3[uVar10] = psVar15[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
        uVar12 = uVar12 + 1;
        psVar15 = psVar15 + uVar9;
      } while (uVar12 != uVar14);
      uVar16 = uVar16 + 1;
      W = W + uVar9 * uVar9;
    } while (uVar16 != uVar13);
  }
  if ((bool)(bVar4 | bVar7)) {
    if (stages < 2) {
      stages = 1;
    }
    uVar5 = 1;
    if (1 < nmat) {
      uVar5 = nmat;
    }
    pppsVar1 = pMVar8->G;
    uVar11 = 0;
    do {
      ppsVar2 = pppsVar1[uVar11];
      uVar14 = 0;
      psVar15 = G;
      do {
        psVar3 = ppsVar2[uVar14];
        uVar13 = 0;
        do {
          psVar3[uVar13] = psVar15[uVar13];
          uVar13 = uVar13 + 1;
        } while ((uint)stages != uVar13);
        uVar14 = uVar14 + 1;
        psVar15 = psVar15 + uVar9;
      } while (uVar14 != (uint)stages);
      uVar11 = uVar11 + 1;
      G = G + uVar9 * uVar9;
    } while (uVar11 != uVar5);
    return pMVar8;
  }
  return pMVar8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Create(int nmat, int stages, int q, int p,
                                       sunrealtype* W, sunrealtype* G,
                                       sunrealtype* c)
{
  int i, j, k;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC = NULL;

  /* Check for legal inputs */
  if (nmat < 1 || stages < 1 || !c) { return (NULL); }

  /* Check for method coefficients and set method type */
  if (W && G) { type = MRISTEP_IMEX; }
  else if (W && !G) { type = MRISTEP_EXPLICIT; }
  else if (!W && G) { type = MRISTEP_IMPLICIT; }
  else { return (NULL); }

  /* Allocate MRIStepCoupling structure */
  MRIC = MRIStepCoupling_Alloc(nmat, stages, type);
  if (!MRIC) { return (NULL); }

  /* -------------------------
   * Copy the inputs into MRIC
   * ------------------------- */

  /* Method and embedding order */
  MRIC->q = q;
  MRIC->p = p;

  /* Abscissae */
  for (i = 0; i < stages; i++) { MRIC->c[i] = c[i]; }

  /* Coupling coefficients stored as 1D arrays of length nmat * stages * stages,
     with each stages * stages matrix stored in C (row-major) order */
  if (type == MRISTEP_EXPLICIT || type == MRISTEP_IMEX)
  {
    for (k = 0; k < nmat; k++)
    {
      for (i = 0; i < stages; i++)
      {
        for (j = 0; j < stages; j++)
        {
          MRIC->W[k][i][j] = W[stages * (stages * k + i) + j];
        }
      }
    }
  }
  if (type == MRISTEP_IMPLICIT || type == MRISTEP_IMEX)
  {
    for (k = 0; k < nmat; k++)
    {
      for (i = 0; i < stages; i++)
      {
        for (j = 0; j < stages; j++)
        {
          MRIC->G[k][i][j] = G[stages * (stages * k + i) + j];
        }
      }
    }
  }

  return (MRIC);
}